

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O2

bool __thiscall
iutest::detail::SocketWriter::Write(SocketWriter *this,void *buf,size_t size,size_t cnt)

{
  ssize_t sVar1;
  long lVar2;
  bool bVar3;
  
  if (*(int *)((this->super_IOutStream)._vptr_IOutStream[-3] +
              (long)&(this->super_IOutStream)._vptr_IOutStream) == -1) {
    bVar3 = false;
  }
  else {
    lVar2 = cnt + 1;
    do {
      lVar2 = lVar2 + -1;
      bVar3 = lVar2 == 0;
      if (bVar3) {
        return bVar3;
      }
      sVar1 = write(*(int *)((this->super_IOutStream)._vptr_IOutStream[-3] +
                            (long)&(this->super_IOutStream)._vptr_IOutStream),buf,(long)(int)size);
    } while (sVar1 != -1);
  }
  return bVar3;
}

Assistant:

virtual bool Write(const void* buf, size_t size, size_t cnt) IUTEST_CXX_OVERRIDE
    {
        if( !IsValid() )
        {
            return false;
        }
        const int size_ = static_cast<int>(size);
        for( size_t i=0; i < cnt; ++i )
        {
#ifdef IUTEST_OS_WINDOWS
            if( send(m_socket, static_cast<const char*>(buf), size_, 0) == SOCKET_ERROR )
            {
                CheckLastError();
                return false;
            }
#else
            if( write(m_socket, buf, size_) == -1 )
            {
                return false;
            }
#endif
        }
        return true;
    }